

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zutil.c
# Opt level: O0

void zPrint_CompCol_Matrix(char *what,SuperMatrix *A)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  double *dp;
  int n;
  int_t i;
  NCformat *Astore;
  SuperMatrix *A_local;
  char *what_local;
  
  printf("\nCompCol matrix %s:\n",what);
  printf("Stype %d, Dtype %d, Mtype %d\n",(ulong)A->Stype,(ulong)A->Dtype,(ulong)A->Mtype);
  iVar1 = A->ncol;
  piVar3 = (int *)A->Store;
  lVar4 = *(long *)(piVar3 + 2);
  printf("nrow %d, ncol %d, nnz %ld\n",(ulong)(uint)A->nrow,(ulong)(uint)A->ncol,(long)*piVar3);
  printf("nzval: ");
  dp._4_4_ = 0;
  while( true ) {
    iVar2 = *(int *)(*(long *)(piVar3 + 6) + (long)iVar1 * 4);
    if (SBORROW4(dp._4_4_,iVar2 * 2) == dp._4_4_ + iVar2 * -2 < 0) break;
    printf("%f  ",*(undefined8 *)(lVar4 + (long)dp._4_4_ * 8));
    dp._4_4_ = dp._4_4_ + 1;
  }
  printf("\nrowind: ");
  dp._4_4_ = 0;
  while( true ) {
    if (*(int *)(*(long *)(piVar3 + 6) + (long)iVar1 * 4) <= dp._4_4_) break;
    printf("%ld  ",(long)*(int *)(*(long *)(piVar3 + 4) + (long)dp._4_4_ * 4));
    dp._4_4_ = dp._4_4_ + 1;
  }
  printf("\ncolptr: ");
  for (dp._4_4_ = 0; dp._4_4_ <= iVar1; dp._4_4_ = dp._4_4_ + 1) {
    printf("%ld  ",(long)*(int *)(*(long *)(piVar3 + 6) + (long)dp._4_4_ * 4));
  }
  printf("\n");
  fflush(_stdout);
  return;
}

Assistant:

void
zPrint_CompCol_Matrix(char *what, SuperMatrix *A)
{
    NCformat     *Astore;
    register int_t i;
    register int n;
    double       *dp;
    
    printf("\nCompCol matrix %s:\n", what);
    printf("Stype %d, Dtype %d, Mtype %d\n", A->Stype,A->Dtype,A->Mtype);
    n = A->ncol;
    Astore = (NCformat *) A->Store;
    dp = (double *) Astore->nzval;
    printf("nrow %d, ncol %d, nnz %ld\n", (int)A->nrow, (int)A->ncol, (long)Astore->nnz);
    printf("nzval: ");
    for (i = 0; i < 2*Astore->colptr[n]; ++i) printf("%f  ", dp[i]);
    printf("\nrowind: ");
    for (i = 0; i < Astore->colptr[n]; ++i) printf("%ld  ", (long)Astore->rowind[i]);
    printf("\ncolptr: ");
    for (i = 0; i <= n; ++i) printf("%ld  ", (long)Astore->colptr[i]);
    printf("\n");
    fflush(stdout);
}